

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O3

void TestSquare(void)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vector<const_char> value;
  Vector<const_char> value_00;
  char buffer [1024];
  Bignum bignum;
  char local_618;
  char cStack_617;
  char cStack_616;
  char cStack_615;
  char cStack_614;
  char cStack_613;
  char cStack_612;
  char cStack_611;
  char cStack_610;
  char cStack_60f;
  char cStack_60e;
  char cStack_60d;
  char cStack_60c;
  char cStack_60b;
  char cStack_60a;
  char cStack_609;
  char cStack_608;
  char cStack_607;
  char cStack_606;
  char cStack_605;
  char cStack_604;
  char cStack_603;
  char cStack_602;
  char cStack_601;
  char cStack_600;
  char cStack_5ff;
  char cStack_5fe;
  char cStack_5fd;
  char cStack_5fc;
  Bignum local_214;
  
  local_214.used_bigits_ = 0;
  local_214.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&local_214,1);
  double_conversion::Bignum::Square(&local_214);
  bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
  if (!bVar1) {
    uVar3 = 0x55a;
LAB_00826f88:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
           ,uVar3,"bignum.ToHexString(buffer, kBufferSize)");
    abort();
  }
  if (CONCAT11(cStack_617,local_618) == 0x31) {
    double_conversion::Bignum::AssignUInt16(&local_214,2);
    double_conversion::Bignum::Square(&local_214);
    bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
    if (!bVar1) {
      uVar3 = 0x55f;
      goto LAB_00826f88;
    }
    if (CONCAT11(cStack_617,local_618) == 0x34) {
      double_conversion::Bignum::AssignUInt16(&local_214,10);
      double_conversion::Bignum::Square(&local_214);
      bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
      if (!bVar1) {
        uVar3 = 0x564;
        goto LAB_00826f88;
      }
      if (cStack_616 == '\0' && CONCAT11(cStack_617,local_618) == 0x3436) {
        value._8_8_ = 7;
        value.start_ = "FFFFFFF";
        double_conversion::Bignum::AssignHexString(&local_214,value);
        double_conversion::Bignum::Square(&local_214);
        bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
        if (!bVar1) {
          uVar3 = 0x569;
          goto LAB_00826f88;
        }
        if (CONCAT17(cStack_60a,
                     CONCAT16(cStack_60b,
                              CONCAT15(cStack_60c,
                                       CONCAT14(cStack_60d,
                                                CONCAT13(cStack_60e,
                                                         CONCAT12(cStack_60f,
                                                                  CONCAT11(cStack_610,cStack_611))))
                                      ))) == 0x31303030303030 &&
            CONCAT17(cStack_611,
                     CONCAT16(cStack_612,
                              CONCAT15(cStack_613,
                                       CONCAT14(cStack_614,
                                                CONCAT13(cStack_615,
                                                         CONCAT12(cStack_616,
                                                                  CONCAT11(cStack_617,local_618)))))
                             )) == 0x3045464646464646) {
          value_00._8_8_ = 0xe;
          value_00.start_ = "FFFFFFFFFFFFFF";
          double_conversion::Bignum::AssignHexString(&local_214,value_00);
          double_conversion::Bignum::Square(&local_214);
          bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
          if (!bVar1) {
            uVar3 = 0x56e;
            goto LAB_00826f88;
          }
          auVar6[0] = -(cStack_60b == 'E');
          auVar6[1] = -(cStack_60a == '0');
          auVar6[2] = -(cStack_609 == '0');
          auVar6[3] = -(cStack_608 == '0');
          auVar6[4] = -(cStack_607 == '0');
          auVar6[5] = -(cStack_606 == '0');
          auVar6[6] = -(cStack_605 == '0');
          auVar6[7] = -(cStack_604 == '0');
          auVar6[8] = -(cStack_603 == '0');
          auVar6[9] = -(cStack_602 == '0');
          auVar6[10] = -(cStack_601 == '0');
          auVar6[0xb] = -(cStack_600 == '0');
          auVar6[0xc] = -(cStack_5ff == '0');
          auVar6[0xd] = -(cStack_5fe == '0');
          auVar6[0xe] = -(cStack_5fd == '1');
          auVar6[0xf] = -(cStack_5fc == '\0');
          auVar5[0] = -(local_618 == 'F');
          auVar5[1] = -(cStack_617 == 'F');
          auVar5[2] = -(cStack_616 == 'F');
          auVar5[3] = -(cStack_615 == 'F');
          auVar5[4] = -(cStack_614 == 'F');
          auVar5[5] = -(cStack_613 == 'F');
          auVar5[6] = -(cStack_612 == 'F');
          auVar5[7] = -(cStack_611 == 'F');
          auVar5[8] = -(cStack_610 == 'F');
          auVar5[9] = -(cStack_60f == 'F');
          auVar5[10] = -(cStack_60e == 'F');
          auVar5[0xb] = -(cStack_60d == 'F');
          auVar5[0xc] = -(cStack_60c == 'F');
          auVar5[0xd] = -(cStack_60b == 'E');
          auVar5[0xe] = -(cStack_60a == '0');
          auVar5[0xf] = -(cStack_609 == '0');
          auVar5 = auVar5 & auVar6;
          if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
            return;
          }
          pcVar2 = "\"FFFFFFFFFFFFFE00000000000001\"";
          pcVar4 = "FFFFFFFFFFFFFE00000000000001";
          uVar3 = 0x56f;
        }
        else {
          pcVar2 = "\"FFFFFFE0000001\"";
          pcVar4 = "FFFFFFE0000001";
          uVar3 = 0x56a;
        }
      }
      else {
        pcVar2 = "\"64\"";
        pcVar4 = "64";
        uVar3 = 0x565;
      }
    }
    else {
      pcVar2 = "\"4\"";
      pcVar4 = "4";
      uVar3 = 0x560;
    }
  }
  else {
    pcVar2 = "\"1\"";
    pcVar4 = "1";
    uVar3 = 0x55b;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar3,pcVar2,"buffer",pcVar4,&local_618);
  abort();
}

Assistant:

TEST(Square) {
  Bignum bignum;
  char buffer[kBufferSize];

  bignum.AssignUInt16(1);
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignUInt16(2);
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("4", buffer);

  bignum.AssignUInt16(10);
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("64", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFE0000001", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFF");
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFE00000000000001", buffer);
}